

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

pair<int,_std::array<int,_3UL>_> __thiscall
QPDF::processXRefW(QPDF *this,QPDFObjectHandle *dict,
                  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged
                  )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPDFExc *pQVar4;
  long lVar5;
  QPDFObjectHandle *pQVar6;
  pair<int,_std::array<int,_3UL>_> pVar7;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> w_vector;
  QPDFObjectHandle W_obj;
  array<int,_3UL> W;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined1 local_60 [32];
  QPDFObjectHandle local_40;
  QPDFObjectHandle local_30;
  
  local_60._0_8_ = (element_type *)(local_60 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"/W","");
  QPDFObjectHandle::getKey(&local_40,(string *)dict);
  if ((element_type *)local_60._0_8_ != (element_type *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,
                    (ulong)((long)&(((BaseHandle *)local_60._16_8_)->obj).
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           + 1));
  }
  bVar1 = QPDFObjectHandle::isArray(&local_40);
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems(&local_40);
    if (2 < iVar2) {
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_60,(int)&local_40);
      bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_60);
      if (bVar1) {
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_70,(int)&local_40);
        bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&local_70);
        if (bVar1) {
          QPDFObjectHandle::getArrayItem(&local_30,(int)&local_40);
          bVar1 = QPDFObjectHandle::isInteger(&local_30);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_30.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _4_4_,local_30.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_30.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_,
                                local_30.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._0_4_));
          }
        }
        else {
          bVar1 = false;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_str !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_str);
        }
      }
      else {
        bVar1 = false;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      }
      if (bVar1 != false) {
        QPDFObjectHandle::getArrayAsVector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_60,&local_40
                  );
        lVar5 = 0;
        pQVar6 = &local_30;
        iVar2 = 0;
        do {
          iVar3 = QPDFObjectHandle::getIntValueAsInt
                            ((QPDFObjectHandle *)
                             ((long)&(((Value *)local_60._0_8_)->
                                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     ).
                                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             + lVar5));
          *(int *)&(pQVar6->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = iVar3;
          if (8 < iVar3) {
            pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
            local_70._M_len = 0x3c;
            local_70._M_str = "Cross-reference stream\'s /W contains impossibly large values";
            if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*damaged->_M_invoker)(pQVar4,(_Any_data *)damaged,&local_70);
LAB_00229da8:
            __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          if (iVar3 < 0) {
            pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
            local_70._M_len = 0x34;
            local_70._M_str = "Cross-reference stream\'s /W contains negative values";
            if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*damaged->_M_invoker)(pQVar4,(_Any_data *)damaged,&local_70);
            goto LAB_00229da8;
          }
          iVar2 = iVar2 + iVar3;
          lVar5 = lVar5 + 0x10;
          pQVar6 = (QPDFObjectHandle *)
                   ((long)&(pQVar6->super_BaseHandle).obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
          if (lVar5 == 0x30) {
            if (iVar2 != 0) {
              pVar7.second._M_elems[2] =
                   local_30.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                   _0_4_;
              pVar7.second._M_elems[1] =
                   local_30.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
              std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_60);
              if (local_40.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_40.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              pVar7.second._M_elems[0] =
                   local_30.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
              pVar7.first = iVar2;
              return pVar7;
            }
            pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
            local_70._M_len = 0x35;
            local_70._M_str = "Cross-reference stream\'s /W indicates entry size of 0";
            if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*damaged->_M_invoker)(pQVar4,(_Any_data *)damaged,&local_70);
            __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
        } while( true );
      }
    }
  }
  pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_60._0_8_ = (element_type *)0x34;
  local_60._8_8_ = "Cross-reference stream does not have a proper /W key";
  if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*damaged->_M_invoker)
            (pQVar4,(_Any_data *)damaged,
             (basic_string_view<char,_std::char_traits<char>_> *)local_60);
  __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

std::pair<int, std::array<int, 3>>
QPDF::processXRefW(QPDFObjectHandle& dict, std::function<QPDFExc(std::string_view)> damaged)
{
    auto W_obj = dict.getKey("/W");
    if (!(W_obj.isArray() && (W_obj.getArrayNItems() >= 3) && W_obj.getArrayItem(0).isInteger() &&
          W_obj.getArrayItem(1).isInteger() && W_obj.getArrayItem(2).isInteger())) {
        throw damaged("Cross-reference stream does not have a proper /W key");
    }

    std::array<int, 3> W;
    int entry_size = 0;
    auto w_vector = W_obj.getArrayAsVector();
    int max_bytes = sizeof(qpdf_offset_t);
    for (size_t i = 0; i < 3; ++i) {
        W[i] = w_vector[i].getIntValueAsInt();
        if (W[i] > max_bytes) {
            throw damaged("Cross-reference stream's /W contains impossibly large values");
        }
        if (W[i] < 0) {
            throw damaged("Cross-reference stream's /W contains negative values");
        }
        entry_size += W[i];
    }
    if (entry_size == 0) {
        throw damaged("Cross-reference stream's /W indicates entry size of 0");
    }
    return {entry_size, W};
}